

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O2

void cleanup_chest_trap(void)

{
  chest_trap *pcVar1;
  chest_trap *old;
  chest_trap *p;
  
  p = chest_traps;
  while (p != (chest_trap *)0x0) {
    string_free(p->name);
    string_free(p->code);
    string_free(p->msg);
    string_free(p->msg_death);
    free_effect(p->effect);
    pcVar1 = p->next;
    mem_free(p);
    p = pcVar1;
  }
  return;
}

Assistant:

static void cleanup_chest_trap(void)
{
	struct chest_trap *trap = chest_traps;
	while (trap) {
		struct chest_trap *old = trap;
		string_free(trap->name);
		string_free(trap->code);
		string_free(trap->msg);
		string_free(trap->msg_death);
		free_effect(trap->effect);
		trap = trap->next;
		mem_free(old);
	}
}